

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfAcesFile.cpp
# Opt level: O2

void __thiscall
Imf_3_4::AcesInputFile::AcesInputFile(AcesInputFile *this,string *name,int numThreads)

{
  Data *pDVar1;
  RgbaInputFile *this_00;
  
  this->_vptr_AcesInputFile = (_func_int **)&PTR__AcesInputFile_001e2c18;
  pDVar1 = (Data *)operator_new(0x70);
  Data::Data(pDVar1);
  this->_data = pDVar1;
  this_00 = (RgbaInputFile *)operator_new(0x40);
  RgbaInputFile::RgbaInputFile(this_00,(name->_M_dataplus)._M_p,numThreads);
  pDVar1 = this->_data;
  pDVar1->rgbaFile = this_00;
  Data::initColorConversion(pDVar1);
  return;
}

Assistant:

AcesInputFile::AcesInputFile (const std::string& name, int numThreads)
    : _data (new Data)
{
    _data->rgbaFile = new RgbaInputFile (name.c_str (), numThreads);
    _data->initColorConversion ();
}